

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O2

void __thiscall Fl_Window::combine_mask(Fl_Window *this)

{
  shape_data_type *psVar1;
  int iVar2;
  undefined8 uVar3;
  code *pcVar4;
  long *plVar5;
  Pixmap PVar6;
  Window WVar7;
  int shapeEventBase;
  int error_base;
  undefined4 extraout_var;
  
  if (combine_mask()::beenhere == '\0') {
    combine_mask()::beenhere = '\x01';
    fl_open_display();
    uVar3 = dlopen(0,1);
    pcVar4 = (code *)dlsym(uVar3,"XShapeQueryExtension");
    combine_mask::XShapeCombineMask_f = (XShapeCombineMask_type)dlsym(uVar3,"XShapeCombineMask");
    if (combine_mask::XShapeCombineMask_f != (XShapeCombineMask_type)0x0 && pcVar4 != (code *)0x0) {
      iVar2 = (*pcVar4)(fl_display,&shapeEventBase,&error_base);
      if (iVar2 != 0) goto LAB_001d89a7;
    }
    combine_mask::XShapeCombineMask_f = (XShapeCombineMask_type)0x0;
  }
LAB_001d89a7:
  psVar1 = shape_data_;
  if (combine_mask::XShapeCombineMask_f != (XShapeCombineMask_type)0x0) {
    shape_data_->lw_ = (this->super_Fl_Group).super_Fl_Widget.w_;
    psVar1->lh_ = (this->super_Fl_Group).super_Fl_Widget.h_;
    iVar2 = (*psVar1->shape_->_vptr_Fl_Image[2])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar2);
    iVar2 = 0;
    if (this->i == (Fl_X *)0x0) {
      WVar7 = 0;
    }
    else {
      WVar7 = this->i->xid;
    }
    PVar6 = XCreateBitmapFromData(fl_display,WVar7,*(undefined8 *)plVar5[4],(int)plVar5[1]);
    if (this->i != (Fl_X *)0x0) {
      iVar2 = (int)this->i->xid;
    }
    (*combine_mask::XShapeCombineMask_f)(fl_display,iVar2,0,0,0,PVar6,0);
    if (PVar6 != 0) {
      XFreePixmap(fl_display,PVar6);
    }
    (**(code **)(*plVar5 + 8))(plVar5);
  }
  return;
}

Assistant:

void Fl_Window::combine_mask()
{
  typedef void (*XShapeCombineMask_type)(Display*, int, int, int, int, Pixmap, int);
  static XShapeCombineMask_type XShapeCombineMask_f = NULL;
  static int beenhere = 0;
  typedef Bool (*XShapeQueryExtension_type)(Display*, int*, int*);
  if (!beenhere) {
    beenhere = 1;
#if HAVE_DLSYM && HAVE_DLFCN_H
    fl_open_display();
    void *handle = dlopen(NULL, RTLD_LAZY); // search symbols in executable
    XShapeQueryExtension_type XShapeQueryExtension_f = (XShapeQueryExtension_type)dlsym(handle, "XShapeQueryExtension");
    XShapeCombineMask_f = (XShapeCombineMask_type)dlsym(handle, "XShapeCombineMask");
    // make sure that the X server has the SHAPE extension
    int error_base, shapeEventBase;
    if ( !( XShapeQueryExtension_f && XShapeCombineMask_f &&
	   XShapeQueryExtension_f(fl_display, &shapeEventBase, &error_base) ) ) XShapeCombineMask_f = NULL;
#endif
  }
  if (!XShapeCombineMask_f) return;
  shape_data_->lw_ = w();
  shape_data_->lh_ = h();
  Fl_Image* temp = shape_data_->shape_->copy(shape_data_->lw_, shape_data_->lh_);
  Pixmap pbitmap = XCreateBitmapFromData(fl_display, fl_xid(this),
					 (const char*)*temp->data(),
					 temp->w(), temp->h());
  XShapeCombineMask_f(fl_display, fl_xid(this), ShapeBounding, 0, 0, pbitmap, ShapeSet);
  if (pbitmap != None) XFreePixmap(fl_display, pbitmap);
  delete temp;
}